

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcConnectedFaceSet::~IfcConnectedFaceSet(IfcConnectedFaceSet *this)

{
  ~IfcConnectedFaceSet((IfcConnectedFaceSet *)&this[-1].field_0x40);
  return;
}

Assistant:

IfcConnectedFaceSet() : Object("IfcConnectedFaceSet") {}